

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzchangeel.cpp
# Opt level: O0

int64_t TPZChangeEl::NearestNode(TPZGeoMesh *gmesh,TPZVec<double> *x,double tol)

{
  double dVar1;
  double dVar2;
  int64_t iVar3;
  double *pdVar4;
  ostream *poVar5;
  long lVar6;
  TPZVec<double> *in_RSI;
  TPZGeoMesh *in_RDI;
  double in_XMM0_Qa;
  double dVar7;
  int c;
  double dist;
  int64_t n;
  int64_t nnodes;
  TPZVec<double> nodeCoord;
  int meshNode;
  size_t in_stack_000002f8;
  char *in_stack_00000300;
  int64_t in_stack_fffffffffffffed8;
  TPZVec<double> *in_stack_fffffffffffffee0;
  TPZVec<double> *in_stack_fffffffffffffee8;
  TPZGeoNode *in_stack_fffffffffffffef0;
  int64_t in_stack_fffffffffffffef8;
  TPZChunkVector<TPZGeoNode,_10> *in_stack_ffffffffffffff00;
  int local_6c;
  double local_68;
  long local_60;
  TPZVec<double> local_40;
  int local_1c;
  double local_18;
  TPZVec<double> *local_10;
  TPZGeoMesh *local_8;
  
  local_1c = -1;
  local_18 = in_XMM0_Qa;
  local_10 = in_RSI;
  local_8 = in_RDI;
  TPZVec<double>::TPZVec(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  iVar3 = TPZGeoMesh::NNodes((TPZGeoMesh *)0x1803e4a);
  local_60 = 0;
  do {
    if (iVar3 <= local_60) {
LAB_0180407d:
      if (local_1c == -1) {
        poVar5 = std::operator<<((ostream *)&std::cout,"Node not found for coordinates ( ");
        pdVar4 = TPZVec<double>::operator[](local_10,0);
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,*pdVar4);
        poVar5 = std::operator<<(poVar5," , ");
        pdVar4 = TPZVec<double>::operator[](local_10,1);
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,*pdVar4);
        poVar5 = std::operator<<(poVar5," , ");
        pdVar4 = TPZVec<double>::operator[](local_10,2);
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,*pdVar4);
        poVar5 = std::operator<<(poVar5," )");
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        poVar5 = std::operator<<((ostream *)&std::cout,"See ");
        in_stack_fffffffffffffee0 =
             (TPZVec<double> *)
             std::operator<<(poVar5,
                             "static int64_t TPZChangeEl::NearestNode(TPZGeoMesh *, TPZVec<REAL> &, double)"
                            );
        std::ostream::operator<<(in_stack_fffffffffffffee0,std::endl<char,std::char_traits<char>>);
        pzinternal::DebugStopImpl(in_stack_00000300,in_stack_000002f8);
      }
      lVar6 = (long)local_1c;
      TPZVec<double>::~TPZVec(in_stack_fffffffffffffee0);
      return lVar6;
    }
    local_68 = 0.0;
    TPZGeoMesh::NodeVec(local_8);
    TPZChunkVector<TPZGeoNode,_10>::operator[](in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    TPZGeoNode::GetCoordinates(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    for (local_6c = 0; local_6c < 3; local_6c = local_6c + 1) {
      pdVar4 = TPZVec<double>::operator[](local_10,(long)local_6c);
      dVar7 = *pdVar4;
      pdVar4 = TPZVec<double>::operator[](&local_40,(long)local_6c);
      dVar1 = *pdVar4;
      pdVar4 = TPZVec<double>::operator[](local_10,(long)local_6c);
      dVar2 = *pdVar4;
      pdVar4 = TPZVec<double>::operator[](&local_40,(long)local_6c);
      local_68 = (dVar7 - dVar1) * (dVar2 - *pdVar4) + local_68;
    }
    dVar7 = sqrt(local_68);
    if (dVar7 <= local_18) {
      local_1c = (int)local_60;
      goto LAB_0180407d;
    }
    local_60 = local_60 + 1;
  } while( true );
}

Assistant:

int64_t TPZChangeEl::NearestNode(TPZGeoMesh * gmesh, TPZVec<REAL> &x, double tol)
{
	int meshNode = -1;
	
	TPZVec<REAL> nodeCoord(3);
	int64_t nnodes = gmesh->NNodes();
	
	for(int64_t n = 0; n < nnodes; n++)
	{
		double dist = 0.;
		gmesh->NodeVec()[n].GetCoordinates(nodeCoord);
		for(int c = 0; c < 3; c++)
		{
			dist += (x[c] - nodeCoord[c])*(x[c] - nodeCoord[c]);
		}
		dist = sqrt(dist);
		
		if(dist <= tol)
		{
			meshNode = n;
			break;
		}
	}
	
	if(meshNode == -1)
	{
		std::cout << "Node not found for coordinates ( " << x[0] << " , " << x[1] << " , " << x[2] << " )" << std::endl;
		std::cout << "See " << __PRETTY_FUNCTION__ << std::endl;
		
		DebugStop();
	}
	
	return meshNode;
}